

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O1

bool CheckRTL8211F_RegIO(AmpIO *Board,uint chan,uint phyAddr)

{
  bool bVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  char *pcVar5;
  uint16_t mask;
  uint16_t data;
  uint16_t curPage;
  uint16_t mask_read;
  uint16_t curIner;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  bVar1 = FpgaIO::ReadRTL8211F_Register
                    (&Board->super_FpgaIO,chan,phyAddr,0x1f,(uint16_t *)((long)&uStack_38 + 2));
  if (bVar1) {
    if (uStack_38._2_2_ != 0xa42) {
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Changing page from ",0x13);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," to ",4);
      plVar3 = (long *)std::ostream::operator<<((ostream *)poVar2,0xa42);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      bVar1 = FpgaIO::WriteRTL8211F_Register(&Board->super_FpgaIO,chan,phyAddr,0x1f,0xa42);
      if (!bVar1) {
        pcVar5 = "Failed to write PHY";
        lVar4 = 0x13;
        goto LAB_00106c50;
      }
    }
    bVar1 = FpgaIO::ReadRTL8211F_Register
                      (&Board->super_FpgaIO,chan,phyAddr,0x12,(uint16_t *)((long)&uStack_38 + 6));
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Testing RTL8211F PHY",0x14);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2," Register I/O, initial value = ",0x1f);
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      bVar1 = true;
      data = 1;
      do {
        FpgaIO::WriteRTL8211F_Register(&Board->super_FpgaIO,chan,phyAddr,0x12,data);
        FpgaIO::ReadRTL8211F_Register
                  (&Board->super_FpgaIO,chan,phyAddr,0x12,(uint16_t *)((long)&uStack_38 + 4));
        if (data != uStack_38._4_2_) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Error: wrote ",0xd);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", read ",7);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          bVar1 = false;
        }
        data = data * 2;
      } while (data != 0);
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test complete",0xd);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      FpgaIO::WriteRTL8211F_Register(&Board->super_FpgaIO,chan,phyAddr,0x12,uStack_38._6_2_);
      FpgaIO::WriteRTL8211F_Register(&Board->super_FpgaIO,chan,phyAddr,0x1f,uStack_38._2_2_);
      return bVar1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to read PHY",0x12);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    pcVar5 = " INER";
    lVar4 = 5;
  }
  else {
    pcVar5 = "Failed to read PHY";
    lVar4 = 0x12;
LAB_00106c50:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar4);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    pcVar5 = " PAGSR";
    lVar4 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return false;
}

Assistant:

bool CheckRTL8211F_RegIO(AmpIO &Board, unsigned int chan, unsigned int phyAddr)
{
    uint16_t curPage;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, curPage)) {
        std::cout << "Failed to read PHY" << chan << " PAGSR" << std::endl;
        return false;
    }
    if (curPage != FpgaIO::RTL8211F_PAGE_DEFAULT) {
        std::cout << std::hex << "Changing page from " << curPage << " to " << FpgaIO::RTL8211F_PAGE_DEFAULT << std::endl;
        if (!Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, FpgaIO::RTL8211F_PAGE_DEFAULT)) {
            std::cout << "Failed to write PHY" << chan << " PAGSR" << std::endl;
            return false;
        }
    }
    // Perform walking bit test on INER (interrupt enable register, 18)
    uint16_t curIner, mask_read;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_INER, curIner)) {
        std::cout << "Failed to read PHY" << chan << " INER" << std::endl;
        return false;
    }
    std::cout << "Testing RTL8211F PHY" << chan << " Register I/O, initial value = " << std::hex << curIner << std::endl;
    bool allOK = true;
    for (uint16_t mask = 0x1; mask != 0; mask <<= 1) {
        Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_INER, mask);
        Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_INER, mask_read);
        if (mask != mask_read) {
            std::cout << "Error: wrote " << mask << ", read " << mask_read << std::endl;
            allOK = false;
            //break;
        }
    }
    std::cout << std::dec << "Test complete" << std::endl;
    // Restore original values
    Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_INER, curIner);
    Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, curPage);
    return allOK;
}